

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_RTreeBBox * NodeCover(ON_RTreeBBox *__return_storage_ptr__,ON_RTreeNode *a_node)

{
  double *pdVar1;
  ON_RTreeBranch *local_20;
  ON_RTreeBranch *branch;
  int i;
  ON_RTreeNode *a_node_local;
  
  if (a_node->m_count < 1) {
    InitRect(__return_storage_ptr__);
  }
  else {
    branch._4_4_ = a_node->m_count + -1;
    memcpy(__return_storage_ptr__,a_node->m_branch + branch._4_4_,0x30);
    local_20 = a_node->m_branch;
    for (; branch._4_4_ != 0; branch._4_4_ = branch._4_4_ + -1) {
      if ((local_20->m_rect).m_min[0] <= __return_storage_ptr__->m_min[0] &&
          __return_storage_ptr__->m_min[0] != (local_20->m_rect).m_min[0]) {
        __return_storage_ptr__->m_min[0] = (local_20->m_rect).m_min[0];
      }
      pdVar1 = (local_20->m_rect).m_min + 1;
      if (*pdVar1 <= __return_storage_ptr__->m_min[1] && __return_storage_ptr__->m_min[1] != *pdVar1
         ) {
        __return_storage_ptr__->m_min[1] = (local_20->m_rect).m_min[1];
      }
      pdVar1 = (local_20->m_rect).m_min + 2;
      if (*pdVar1 <= __return_storage_ptr__->m_min[2] && __return_storage_ptr__->m_min[2] != *pdVar1
         ) {
        __return_storage_ptr__->m_min[2] = (local_20->m_rect).m_min[2];
      }
      if (__return_storage_ptr__->m_max[0] < (local_20->m_rect).m_max[0]) {
        __return_storage_ptr__->m_max[0] = (local_20->m_rect).m_max[0];
      }
      if (__return_storage_ptr__->m_max[1] < (local_20->m_rect).m_max[1]) {
        __return_storage_ptr__->m_max[1] = (local_20->m_rect).m_max[1];
      }
      if (__return_storage_ptr__->m_max[2] < (local_20->m_rect).m_max[2]) {
        __return_storage_ptr__->m_max[2] = (local_20->m_rect).m_max[2];
      }
      local_20 = local_20 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ON_RTreeBBox NodeCover(ON_RTreeNode* a_node)
{
  int i;
  const ON_RTreeBranch* branch;
  ON_RTreeBBox rect;

  if ( (i = a_node->m_count) > 0 )
  {
    rect = a_node->m_branch[--i].m_rect;
    for ( branch = a_node->m_branch; i; i--, branch++ )
    {
#if (3 == ON_RTree_NODE_DIM)
      if ( rect.m_min[0] > branch->m_rect.m_min[0] )
        rect.m_min[0] = branch->m_rect.m_min[0];
      if ( rect.m_min[1] > branch->m_rect.m_min[1] )
        rect.m_min[1] = branch->m_rect.m_min[1];
      if ( rect.m_min[2] > branch->m_rect.m_min[2] )
        rect.m_min[2] = branch->m_rect.m_min[2];
      if ( rect.m_max[0] < branch->m_rect.m_max[0] )
        rect.m_max[0] = branch->m_rect.m_max[0];
      if ( rect.m_max[1] < branch->m_rect.m_max[1] )
        rect.m_max[1] = branch->m_rect.m_max[1];
      if ( rect.m_max[2] < branch->m_rect.m_max[2] )
        rect.m_max[2] = branch->m_rect.m_max[2];
#else
      for( int j = 0; j < ON_RTree_NODE_DIM; j++ )
      {
        if ( rect.m_min[j] > branch->m_rect.m_min[j] )
          rect.m_min[j] = branch->m_rect.m_min[j];
        if ( rect.m_max[j] < branch->m_rect.m_max[j] )
          rect.m_max[j] = branch->m_rect.m_max[j];
      }
#endif
    }
  }
  else
  {
    InitRect(&rect);
  }

  return rect;
}